

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

size_t cookiehash(char *domain)

{
  _Bool _Var1;
  byte bVar2;
  byte bVar3;
  char *pcVar4;
  void *pvVar5;
  char *pcVar6;
  
  if (domain == (char *)0x0) {
    return 0;
  }
  _Var1 = Curl_host_is_ipnum(domain);
  if (!_Var1) {
    pcVar4 = (char *)strlen(domain);
    pvVar5 = Curl_memrchr(domain,0x2e,(size_t)pcVar4);
    if ((pvVar5 == (void *)0x0) ||
       (pvVar5 = Curl_memrchr(domain,0x2e,(long)pvVar5 - (long)domain), pvVar5 == (void *)0x0)) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = (char *)((long)pvVar5 + 1);
      pcVar4 = domain + ((long)pcVar4 - (long)pcVar6);
    }
    if (pcVar6 != (char *)0x0) {
      domain = pcVar6;
    }
    pcVar4 = domain + (long)pcVar4;
    bVar3 = 5;
    for (; domain < pcVar4; domain = domain + 1) {
      bVar2 = Curl_raw_toupper(*domain);
      bVar3 = bVar2 ^ bVar3 * '!';
    }
    return (ulong)bVar3;
  }
  return 0;
}

Assistant:

static size_t cookiehash(const char * const domain)
{
  const char *top;
  size_t len;

  if(!domain || Curl_host_is_ipnum(domain))
    return 0;

  top = get_top_domain(domain, &len);
  return cookie_hash_domain(top, len);
}